

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

entry_type __thiscall fasttext::Dictionary::getType(Dictionary *this,string *w)

{
  element_type *peVar1;
  long lVar2;
  string *in_RSI;
  entry_type local_1;
  
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x162757);
  lVar2 = std::__cxx11::string::find(in_RSI,(ulong)&peVar1->label);
  if (lVar2 == 0) {
    local_1 = label;
  }
  else {
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x162790);
    lVar2 = std::__cxx11::string::find(in_RSI,(ulong)&peVar1->id);
    if (lVar2 == 0) {
      local_1 = id;
    }
    else {
      local_1 = word;
    }
  }
  return local_1;
}

Assistant:

entry_type Dictionary::getType(const std::string& w) const {
	if(w.find(args_->label) == 0)
		return entry_type::label;
	else
	{
		if(w.find(args_->id) == 0)
			return entry_type::id;
		else
			return entry_type::word;
	}
}